

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * Matrix4f::rotation(Quat4f *q)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Matrix4f *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float xw;
  float yz;
  float yw;
  float xz;
  float zw;
  float xy;
  float zz;
  float yy;
  float xx;
  Quat4f qq;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Quat4f local_20 [2];
  
  Quat4f::normalized((Quat4f *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  fVar4 = Quat4f::x(local_20);
  fVar5 = Quat4f::x(local_20);
  fVar6 = Quat4f::y(local_20);
  fVar7 = Quat4f::y(local_20);
  fVar8 = Quat4f::z(local_20);
  fVar9 = Quat4f::z(local_20);
  fVar10 = Quat4f::x(local_20);
  fVar11 = Quat4f::y(local_20);
  fVar12 = Quat4f::z(local_20);
  fVar13 = Quat4f::w(local_20);
  fVar14 = Quat4f::x(local_20);
  fVar15 = Quat4f::z(local_20);
  fVar16 = Quat4f::y(local_20);
  fVar17 = Quat4f::w(local_20);
  fVar18 = Quat4f::y(local_20);
  fVar19 = Quat4f::z(local_20);
  fVar20 = Quat4f::x(local_20);
  fVar21 = Quat4f::w(local_20);
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),
                           ZEXT416((uint)(fVar6 * fVar7 + fVar8 * fVar9)),
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),
                           ZEXT416((uint)(fVar4 * fVar5 + fVar8 * fVar9)),
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),
                           ZEXT416((uint)(fVar4 * fVar5 + fVar6 * fVar7)),
                           SUB6416(ZEXT464(0x3f800000),0));
  Matrix4f(in_RDI,auVar1._0_4_,(fVar10 * fVar11 - fVar12 * fVar13) * 2.0,
           (fVar14 * fVar15 + fVar16 * fVar17) * 2.0,0.0,(fVar10 * fVar11 + fVar12 * fVar13) * 2.0,
           auVar2._0_4_,(fVar18 * fVar19 - fVar20 * fVar21) * 2.0,0.0,
           (fVar14 * fVar15 - fVar16 * fVar17) * 2.0,(fVar18 * fVar19 + fVar20 * fVar21) * 2.0,
           auVar3._0_4_,0.0,0.0,0.0,0.0,1.0);
  return in_RDI;
}

Assistant:

Matrix4f Matrix4f::rotation( const Quat4f& q )
{
	Quat4f qq = q.normalized();

	float xx = qq.x() * qq.x();
	float yy = qq.y() * qq.y();
	float zz = qq.z() * qq.z();

	float xy = qq.x() * qq.y();
	float zw = qq.z() * qq.w();

	float xz = qq.x() * qq.z();
	float yw = qq.y() * qq.w();

	float yz = qq.y() * qq.z();
	float xw = qq.x() * qq.w();

	return Matrix4f
	(
		1.0f - 2.0f * ( yy + zz ),		2.0f * ( xy - zw ),				2.0f * ( xz + yw ),				0.0f,
		2.0f * ( xy + zw ),				1.0f - 2.0f * ( xx + zz ),		2.0f * ( yz - xw ),				0.0f,
		2.0f * ( xz - yw ),				2.0f * ( yz + xw ),				1.0f - 2.0f * ( xx + yy ),		0.0f,
		0.0f,							0.0f,							0.0f,							1.0f
	);
}